

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc.cc
# Opt level: O2

value_type __thiscall my_crc_basic::checksum(my_crc_basic *this)

{
  value_type x;
  
  x = this->rem_;
  if (this->rft_out_ == true) {
    x = reflect(this,x);
  }
  return (x ^ this->final_) & this->sig_bits;
}

Assistant:

my_crc_basic::value_type my_crc_basic::checksum() const {
  return ( (rft_out_ ? reflect( rem_ ) : rem_)
	   ^ final_ ) & sig_bits;
}